

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O2

base_learner * confidence_setup(options_i *options,vw *all)

{
  option_group_definition *this;
  base_learner *l;
  single_learner *base;
  learner<confidence,_example> *plVar1;
  ostream *poVar2;
  code *predict;
  code *learn;
  bool confidence_after_training;
  bool confidence_arg;
  option_group_definition new_options;
  free_ptr<confidence> data;
  bool local_37e;
  bool local_37d;
  allocator local_37c;
  allocator local_37b;
  allocator local_37a;
  allocator local_379;
  string local_378 [32];
  string local_358;
  string local_338 [32];
  string local_318;
  string local_2f8;
  option_group_definition local_2d8;
  undefined1 local_2a0 [112];
  bool local_230;
  undefined1 local_200 [160];
  typed_option<bool> local_160;
  typed_option<bool> local_c0;
  
  local_37d = false;
  local_37e = false;
  std::__cxx11::string::string((string *)&local_2f8,"Confidence",(allocator *)local_2a0);
  VW::config::option_group_definition::option_group_definition(&local_2d8,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_318,"confidence",&local_379);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a0,&local_318,&local_37d);
  local_230 = true;
  std::__cxx11::string::string(local_338,"Get confidence for binary predictions",&local_37a);
  std::__cxx11::string::_M_assign((string *)(local_2a0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c0,(typed_option<bool> *)local_2a0);
  this = VW::config::option_group_definition::add<bool>(&local_2d8,&local_c0);
  std::__cxx11::string::string((string *)&local_358,"confidence_after_training",&local_37b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_200,&local_358,&local_37e);
  std::__cxx11::string::string(local_378,"Confidence after training",&local_37c);
  std::__cxx11::string::_M_assign((string *)(local_200 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_160,(typed_option<bool> *)local_200);
  VW::config::option_group_definition::add<bool>(this,&local_160);
  VW::config::typed_option<bool>::~typed_option(&local_160);
  std::__cxx11::string::~string(local_378);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_200);
  std::__cxx11::string::~string((string *)&local_358);
  VW::config::typed_option<bool>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_338);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a0);
  std::__cxx11::string::~string((string *)&local_318);
  (**options->_vptr_options_i)(options,&local_2d8);
  if (local_37d != false) {
    if (all->training != false) {
      scoped_calloc_or_throw<confidence>();
      *(vw **)local_2a0._8_8_ = all;
      learn = predict_or_learn_with_confidence<true,false>;
      if (local_37e != false) {
        learn = predict_or_learn_with_confidence<true,true>;
      }
      predict = predict_or_learn_with_confidence<false,false>;
      if (local_37e != false) {
        predict = predict_or_learn_with_confidence<false,true>;
      }
      l = setup_base(options,all);
      base = LEARNER::as_singleline<char,char>(l);
      plVar1 = LEARNER::init_learner<confidence,example,LEARNER::learner<char,example>>
                         ((free_ptr<confidence> *)local_2a0,base,learn,predict);
      *(undefined8 *)(plVar1 + 0x58) = *(undefined8 *)(plVar1 + 0x18);
      *(code **)(plVar1 + 0x68) = return_confidence_example;
      std::unique_ptr<confidence,_void_(*)(void_*)>::~unique_ptr
                ((unique_ptr<confidence,_void_(*)(void_*)> *)local_2a0);
      goto LAB_001a38af;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when saving the model and avoid --test_only"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  plVar1 = (learner<confidence,_example> *)0x0;
LAB_001a38af:
  VW::config::option_group_definition::~option_group_definition(&local_2d8);
  return (base_learner *)plVar1;
}

Assistant:

base_learner* confidence_setup(options_i& options, vw& all)
{
  bool confidence_arg = false;
  bool confidence_after_training = false;
  option_group_definition new_options("Confidence");
  new_options.add(make_option("confidence", confidence_arg).keep().help("Get confidence for binary predictions"))
      .add(make_option("confidence_after_training", confidence_after_training).help("Confidence after training"));
  options.add_and_parse(new_options);

  if (!confidence_arg)
    return nullptr;

  if (!all.training)
  {
    cout << "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when "
            "saving the model and avoid --test_only"
         << endl;
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<confidence>();
  data->all = &all;

  void (*learn_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;
  void (*predict_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;

  if (confidence_after_training)
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, true>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, true>;
  }
  else
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, false>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, false>;
  }

  // Create new learner
  learner<confidence, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), learn_with_confidence_ptr, predict_with_confidence_ptr);

  l.set_finish_example(return_confidence_example);

  return make_base(l);
}